

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O1

Test * CLParserTestDuplicatedHeader::Create(void)

{
  g_current_test = (Test *)operator_new(0x10);
  g_current_test->failed_ = false;
  g_current_test->assertion_failures_ = 0;
  g_current_test->_vptr_Test = (_func_int **)&PTR__Test_001d40c0;
  return g_current_test;
}

Assistant:

TEST(CLParserTest, DuplicatedHeader) {
  CLParser parser;
  string output, err;
  ASSERT_TRUE(parser.Parse(
      "Note: including file: foo.h\r\n"
      "Note: including file: bar.h\r\n"
      "Note: including file: foo.h\r\n",
      "", &output, &err));
  // We should have dropped one copy of foo.h.
  ASSERT_EQ("", output);
  ASSERT_EQ(2u, parser.includes_.size());
}